

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.hpp
# Opt level: O2

void __thiscall OpenMD::BondStamp::overrideType(BondStamp *this,string *type,RealType pars)

{
  RealType local_18;
  
  local_18 = pars;
  std::__cxx11::string::_M_assign((string *)&this->orType_);
  std::vector<double,_std::allocator<double>_>::push_back(&this->orPars_,&local_18);
  this->hasOverride_ = true;
  return;
}

Assistant:

void overrideType(std::string type, RealType pars) {
      orType_ = type;
      orPars_.push_back(pars);
      hasOverride_ = true;
    }